

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_Array.cc
# Opt level: O1

Rectangle * __thiscall
QPDFObjectHandle::getArrayAsRectangle(Rectangle *__return_storage_ptr__,QPDFObjectHandle *this)

{
  element_type *peVar1;
  _Head_base<0UL,_QPDF_Array::Sparse_*,_false> _Var2;
  __index_type _Var3;
  bool bVar4;
  variant_alternative_t<15UL,_variant<monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>_>
  *pvVar5;
  QPDF_Array *pQVar6;
  int iVar7;
  double *value;
  long lVar8;
  double dVar9;
  double dVar10;
  Array array;
  QPDFObjectHandle item;
  double items [4];
  Array local_98;
  QPDFObjectHandle local_78;
  double local_68;
  double local_60;
  double local_58;
  double local_50;
  pair<bool,_QPDFObjectHandle> local_48;
  
  peVar1 = (this->super_BaseHandle).obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  if (peVar1 == (element_type *)0x0) {
    _Var3 = '\0';
  }
  else {
    _Var3 = (peVar1->value).
            super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
            .
            super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
            .
            super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
            .
            super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
            .
            super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
            .
            super__Variant_storage_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
            ._M_index;
    if (_Var3 == '\x0f') {
      pvVar5 = std::
               get<15ul,std::monostate,QPDF_Reserved,QPDF_Null,QPDF_Bool,QPDF_Integer,QPDF_Real,QPDF_String,QPDF_Name,QPDF_Array,QPDF_Dictionary,QPDF_Stream,QPDF_Operator,QPDF_InlineImage,QPDF_Unresolved,QPDF_Destroyed,QPDF_Reference>
                         (&peVar1->value);
    }
    else {
      if (_Var3 != '\r') goto LAB_001fdc7f;
      pvVar5 = (variant_alternative_t<15UL,_variant<monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>_>
                *)QPDF::resolve(peVar1->qpdf,*(QPDFObjGen *)&(peVar1->og).obj);
    }
    _Var3 = *(__index_type *)
             ((long)&(((pvVar5->obj).super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->value).
                     super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                     .
                     super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                     .
                     super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                     .
                     super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
             + 0x30);
  }
LAB_001fdc7f:
  if (_Var3 == '\b') {
    local_98.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (this->super_BaseHandle).obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
    local_98.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi =
         (this->super_BaseHandle).obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
    if (local_98.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_98.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_98.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
             _M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_98.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_98.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
             _M_use_count + 1;
      }
    }
  }
  else {
    local_98.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)0x0;
    local_98.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  peVar1 = local_98.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  local_98.sp_elements._M_t.
  super___uniq_ptr_impl<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>,_std::default_delete<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_*,_std::default_delete<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>
  .super__Head_base<0UL,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_*,_false>.
  _M_head_impl = (__uniq_ptr_data<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>,_std::default_delete<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>,_true,_true>
                  )(__uniq_ptr_impl<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>,_std::default_delete<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>
                    )0x0;
  if (local_98.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr != (element_type *)0x0) {
    pQVar6 = ::qpdf::Array::array(&local_98);
    _Var2._M_head_impl =
         (pQVar6->sp)._M_t.
         super___uniq_ptr_impl<QPDF_Array::Sparse,_std::default_delete<QPDF_Array::Sparse>_>._M_t.
         super__Tuple_impl<0UL,_QPDF_Array::Sparse_*,_std::default_delete<QPDF_Array::Sparse>_>.
         super__Head_base<0UL,_QPDF_Array::Sparse_*,_false>._M_head_impl;
    if (_Var2._M_head_impl == (Sparse *)0x0) {
      iVar7 = (int)((ulong)((long)(pQVar6->elements).
                                  super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(pQVar6->elements).
                                 super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 4);
    }
    else {
      iVar7 = (_Var2._M_head_impl)->size;
    }
    if (iVar7 == 4) {
      value = &local_68;
      lVar8 = 0;
      do {
        ::qpdf::Array::at(&local_48,&local_98,(int)lVar8);
        local_78.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = local_48.second.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_78.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi =
             local_48.second.super_BaseHandle.obj.
             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
        bVar4 = getValueAsNumber(&local_78,value);
        if (!bVar4) {
          __return_storage_ptr__->urx = 0.0;
          __return_storage_ptr__->ury = 0.0;
          __return_storage_ptr__->llx = 0.0;
          __return_storage_ptr__->lly = 0.0;
          if (local_78.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_78.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
            ;
          }
          goto LAB_001fddd6;
        }
        if (local_78.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_78.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
        }
        lVar8 = lVar8 + 1;
        value = value + 1;
      } while (lVar8 != 4);
      dVar9 = local_58;
      if (local_68 <= local_58) {
        dVar9 = local_68;
      }
      dVar10 = local_50;
      if (local_60 <= local_50) {
        dVar10 = local_60;
      }
      if (local_58 <= local_68) {
        local_58 = local_68;
      }
      if (local_50 <= local_60) {
        local_50 = local_60;
      }
      __return_storage_ptr__->llx = dVar9;
      __return_storage_ptr__->lly = dVar10;
      __return_storage_ptr__->urx = local_58;
      __return_storage_ptr__->ury = local_50;
    }
    else {
      __return_storage_ptr__->urx = 0.0;
      __return_storage_ptr__->ury = 0.0;
      __return_storage_ptr__->llx = 0.0;
      __return_storage_ptr__->lly = 0.0;
    }
  }
LAB_001fddd6:
  std::
  unique_ptr<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>,_std::default_delete<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>
  ::~unique_ptr(&local_98.sp_elements);
  if (local_98.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_98.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (peVar1 == (element_type *)0x0) {
    __return_storage_ptr__->urx = 0.0;
    __return_storage_ptr__->ury = 0.0;
    __return_storage_ptr__->llx = 0.0;
    __return_storage_ptr__->lly = 0.0;
  }
  return __return_storage_ptr__;
}

Assistant:

QPDFObjectHandle::Rectangle
QPDFObjectHandle::getArrayAsRectangle() const
{
    if (auto array = as_array(strict)) {
        if (array.size() != 4) {
            return {};
        }
        double items[4];
        for (int i = 0; i < 4; ++i) {
            if (auto item = array.at(i).second; !item.getValueAsNumber(items[i])) {
                return {};
            }
        }
        return {
            std::min(items[0], items[2]),
            std::min(items[1], items[3]),
            std::max(items[0], items[2]),
            std::max(items[1], items[3])};
    }
    return {};
}